

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::~Arg(Arg *this)

{
  Arg *this_local;
  
  std::__cxx11::string::~string((string *)&this->hint);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->longName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->shortNames);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&this->boundField);
  return;
}

Assistant:

bool hasShortName( std::string const& shortName ) const {
                for(    std::vector<std::string>::const_iterator
                            it = shortNames.begin(), itEnd = shortNames.end();
                        it != itEnd;
                        ++it )
                    if( *it == shortName )
                        return true;
                return false;
            }